

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

bool absl::lts_20240722::container_internal::operator==(iterator *a,iterator *b)

{
  ctrl_t *pcVar1;
  ctrl_t *ctrl_b;
  GenerationType GVar2;
  GenerationType *pGVar3;
  GenerationType *generation_ptr_b;
  anon_union_8_1_a8a14541_for_iterator_2 local_28;
  anon_union_8_1_a8a14541_for_iterator_2 local_20;
  iterator *local_18;
  iterator *b_local;
  iterator *a_local;
  
  pcVar1 = a->ctrl_;
  local_18 = b;
  b_local = a;
  GVar2 = HashSetIteratorGenerationInfoDisabled::generation
                    ((HashSetIteratorGenerationInfoDisabled *)a);
  pGVar3 = HashSetIteratorGenerationInfoDisabled::generation_ptr
                     ((HashSetIteratorGenerationInfoDisabled *)b_local);
  AssertIsValidForComparison(pcVar1,GVar2,pGVar3);
  pcVar1 = local_18->ctrl_;
  GVar2 = HashSetIteratorGenerationInfoDisabled::generation
                    ((HashSetIteratorGenerationInfoDisabled *)local_18);
  pGVar3 = HashSetIteratorGenerationInfoDisabled::generation_ptr
                     ((HashSetIteratorGenerationInfoDisabled *)local_18);
  AssertIsValidForComparison(pcVar1,GVar2,pGVar3);
  pcVar1 = b_local->ctrl_;
  ctrl_b = local_18->ctrl_;
  local_20 = b_local->field_1;
  local_28 = local_18->field_1;
  pGVar3 = HashSetIteratorGenerationInfoDisabled::generation_ptr
                     ((HashSetIteratorGenerationInfoDisabled *)b_local);
  generation_ptr_b =
       HashSetIteratorGenerationInfoDisabled::generation_ptr
                 ((HashSetIteratorGenerationInfoDisabled *)local_18);
  AssertSameContainer(pcVar1,ctrl_b,&local_20.slot_,&local_28.slot_,pGVar3,generation_ptr_b);
  return b_local->ctrl_ == local_18->ctrl_;
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }